

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_1_loose_or_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_LOGICAL_OR,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  G->val[-2] = G->ss;
  return;
}

Assistant:

YY_ACTION(void) yy_1_loose_or_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define f2 G->val[-1]
#define f1 G->val[-2]
  yyprintf((stderr, "do yy_1_loose_or_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_LOGICAL_OR, f1, f2); f1=yy; }\n"));
  yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_LOGICAL_OR, f1, f2); f1=yy; ;
#undef f2
#undef f1
}